

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O2

void prsgexp(prscxdef *ctx,prsndef *n)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  uchar uVar4;
  uint lbl;
  int iVar5;
  prsndef *ppVar6;
  uint16_t tmp;
  short sVar7;
  uint uVar8;
  ulong uVar9;
  uint *lblp;
  emtcxdef *peVar10;
  prsndef *nsub;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  do {
    switch(n->prsnnlf) {
    case 0:
      prsdef(ctx,&(n->prsnv).prsnvt,7);
      emtval(ctx->prscxemt,&(n->prsnv).prsnvt,ctx->prscxpool);
      return;
    case 1:
      uVar8 = n->prsntyp;
      uVar9 = (ulong)uVar8;
      if (uVar9 < 0x33) {
        if ((0x4000004cUL >> (uVar9 & 0x3f) & 1) != 0) goto LAB_0011e2d0;
        if (uVar9 == 0x32) {
          ppVar6 = (n->prsnv).prsnvn[0];
          iVar5 = 0;
          goto LAB_0011e235;
        }
      }
      if (3 < uVar8 - 0x96) {
        if (1 < uVar8 - 0x5e) {
          errsigf(ctx->prscxerr,"TADS",0x136);
        }
LAB_0011e2d0:
        prsgexp(ctx,(n->prsnv).prsnvn[0]);
        if (n->prsntyp == 2) {
          return;
        }
        emtres(ctx->prscxemt,1);
        iVar5 = n->prsntyp;
        if (iVar5 == 3) {
          uVar4 = '\x03';
        }
        else if (iVar5 == 0x1e) {
          uVar4 = 'W';
        }
        else if (iVar5 == 0x5e) {
          uVar4 = 'Z';
        }
        else {
          uVar4 = '\x04';
          if (iVar5 == 0x5f) {
            uVar4 = '[';
          }
        }
        peVar10 = ctx->prscxemt;
        uVar2 = peVar10->emtcxofs;
        peVar10->emtcxofs = uVar2 + 1;
        peVar10->emtcxptr[uVar2] = uVar4;
        return;
      }
      ppVar6 = (n->prsnv).prsnvn[0];
LAB_0011e167:
      prsglval(ctx,uVar8,ppVar6);
      return;
    case 2:
      uVar8 = n->prsntyp;
      switch(uVar8) {
      case 0x32:
        iVar5 = prsgargs(ctx,(n->prsnv).prsnvn[1]);
        ppVar6 = (n->prsnv).prsnvn[0];
LAB_0011e235:
        prsgfn(ctx,ppVar6,iVar5);
        return;
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3c:
      case 0x3d:
      case 0x3e:
switchD_0011df09_caseD_33:
        errsigf(ctx->prscxerr,"TADS",0x138);
      case 0x3a:
        prsgexp(ctx,(n->prsnv).prsnvn[0]);
        prsgexp(ctx,(n->prsnv).prsnvn[1]);
        emtres(ctx->prscxemt,1);
        peVar10 = ctx->prscxemt;
        uVar2 = peVar10->emtcxofs;
        peVar10->emtcxofs = uVar2 + 1;
        peVar10->emtcxptr[uVar2] = '@';
        return;
      case 0x3b:
        sVar7 = 0;
        for (; n != (prsndef *)0x0; n = (n->prsnv).prsnvn[1]) {
          prsgexp(ctx,(n->prsnv).prsnvn[0]);
          sVar7 = sVar7 + 1;
        }
        emtres(ctx->prscxemt,1);
        peVar10 = ctx->prscxemt;
        uVar2 = peVar10->emtcxofs;
        peVar10->emtcxofs = uVar2 + 1;
        peVar10->emtcxptr[uVar2] = 'J';
        emtres(ctx->prscxemt,2);
        *(short *)(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs) = sVar7;
LAB_0011e212:
        puVar1 = &ctx->prscxemt->emtcxofs;
        *puVar1 = *puVar1 + 2;
switchD_0011def5_default:
        return;
      case 0x3f:
        prsgexp(ctx,(n->prsnv).prsnvn[0]);
        n = (n->prsnv).prsnvn[1];
        break;
      case 0x40:
        iVar5 = 0;
LAB_0011e2b7:
        prsgdot(ctx,n,iVar5);
        return;
      case 0x41:
      case 0x42:
        lbl = emtglbl(ctx->prscxemt);
        lblp = &local_2c;
        local_2c = lbl;
        prsgexp(ctx,(n->prsnv).prsnvn[0]);
        emtjmp(ctx->prscxemt,n->prsntyp == 0x42 | 0x44,lbl);
        prsgexp(ctx,(n->prsnv).prsnvn[1]);
        peVar10 = ctx->prscxemt;
        goto LAB_0011e0c5;
      default:
        if (uVar8 < 0x20) {
          if ((0x7ffbcU >> (uVar8 & 0x1f) & 1) != 0) {
            prsgexp(ctx,(n->prsnv).prsnvn[0]);
            prsgexp(ctx,(n->prsnv).prsnvn[1]);
            emtres(ctx->prscxemt,1);
            uVar4 = (&prsb_cma.field_0x26)[n->prsntyp];
            peVar10 = ctx->prscxemt;
            uVar2 = peVar10->emtcxofs;
            peVar10->emtcxofs = uVar2 + 1;
            peVar10->emtcxptr[uVar2] = uVar4;
            return;
          }
          if (uVar8 == 0x1f) {
            ppVar6 = (n->prsnv).prsnvn[1];
            prsgexp(ctx,(n->prsnv).prsnvn[0]);
            if ((ppVar6->prsnnlf != 0) || ((ppVar6->prsnv).prsnvt.toktyp != 0x55)) {
              prsgexp(ctx,ppVar6);
              emtres(ctx->prscxemt,1);
              peVar10 = ctx->prscxemt;
              uVar2 = peVar10->emtcxofs;
              peVar10->emtcxofs = uVar2 + 1;
              peVar10->emtcxptr[uVar2] = '\x15';
              return;
            }
            uVar3 = (ppVar6->prsnv).prsnvt.tokofs;
            emtres(ctx->prscxemt,1);
            peVar10 = ctx->prscxemt;
            uVar2 = peVar10->emtcxofs;
            peVar10->emtcxofs = uVar2 + 1;
            peVar10->emtcxptr[uVar2] = '\x13';
            emtres(ctx->prscxemt,2);
            *(ushort *)(ctx->prscxemt->emtcxptr + ctx->prscxemt->emtcxofs) = uVar3;
            goto LAB_0011e212;
          }
        }
        if (10 < uVar8 - 0x9a) goto switchD_0011df09_caseD_33;
        prsgexp(ctx,(n->prsnv).prsnvn[1]);
        uVar8 = n->prsntyp;
        ppVar6 = (n->prsnv).prsnvn[0];
        goto LAB_0011e167;
      }
      break;
    case 3:
      if (n->prsntyp == 0x40) {
        iVar5 = prsgargs(ctx,(n->prsnv).prsnvn[2]);
        goto LAB_0011e2b7;
      }
      if (n->prsntyp == 0x56) {
        prsgexp(ctx,(n->prsnv).prsnvn[0]);
        local_30 = emtglbl(ctx->prscxemt);
        emtjmp(ctx->prscxemt,'\x1b',local_30);
        prsgexp(ctx,(n->prsnv).prsnvn[1]);
        local_34 = emtglbl(ctx->prscxemt);
        lblp = &local_34;
        emtjmp(ctx->prscxemt,'\x1a',local_34);
        emtslbl(ctx->prscxemt,&local_30,1);
        prsgexp(ctx,(n->prsnv).prsnvn[2]);
        peVar10 = ctx->prscxemt;
LAB_0011e0c5:
        emtslbl(peVar10,lblp,1);
      }
    default:
      goto switchD_0011def5_default;
    }
  } while( true );
}

Assistant:

void prsgexp(prscxdef *ctx, prsndef *n)
{
    int cnt;
    
    switch(n->prsnnlf)
    {
    case 0:
        prsdef(ctx, &n->prsnv.prsnvt, TOKSTFWDOBJ);
        emtval(ctx->prscxemt, &n->prsnv.prsnvt, ctx->prscxpool);
        break;
        
    case 1:
        switch(n->prsntyp)
        {
        case TOKTINC:
        case TOKTDEC:
        case TOKTPOSTINC:
        case TOKTPOSTDEC:
            prsglval(ctx, n->prsntyp, n->prsnv.prsnvn[0]);
            break;
            
        case TOKTPLUS:
        case TOKTMINUS:
        case TOKTNOT:
        case TOKTTILDE:
        case TOKTNEW:
        case TOKTDELETE:
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            if (n->prsntyp != TOKTPLUS)
                emtop(ctx->prscxemt,
                      n->prsntyp == TOKTMINUS ? OPCNEG :
                      n->prsntyp == TOKTTILDE ? OPCBNOT :
                      n->prsntyp == TOKTNEW ? OPCNEW :
                      n->prsntyp == TOKTDELETE ? OPCDELETE :
                      OPCNOT);
            break;

        case TOKTLPAR:
            prsgfn(ctx, n->prsnv.prsnvn[0], 0);
            break;

        default:
            errsig(ctx->prscxerr, ERR_REQUNO);
        }
        break;
        
    case 2:
        switch(n->prsntyp)
        {
        case TOKTAND:
        case TOKTOR:
        {
            uint lab;
            
            lab = emtglbl(ctx->prscxemt);
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            emtjmp(ctx->prscxemt,
                   (uchar)(n->prsntyp == TOKTAND ? OPCJSF : OPCJST),
                   lab);
            prsgexp(ctx, n->prsnv.prsnvn[1]);
            emtslbl(ctx->prscxemt, &lab, TRUE);
            break;
        }
        
        case TOKTPLUS:
        case TOKTMINUS:
        case TOKTDIV:
        case TOKTMOD:
        case TOKTTIMES:
        case TOKTEQ:
        case TOKTNE:
        case TOKTGT:
        case TOKTGE:
        case TOKTLT:
        case TOKTLE:
        case TOKTBAND:
        case TOKTBOR:
        case TOKTXOR:
        case TOKTSHL:
        case TOKTSHR:
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            prsgexp(ctx, n->prsnv.prsnvn[1]);
            emtop(ctx->prscxemt, prsbopl[n->prsntyp - TOKTPLUS]);
            break;
            
        case TOKTCOMMA:
            prsgexp(ctx, n->prsnv.prsnvn[0]);
            prsgexp(ctx, n->prsnv.prsnvn[1]);
            break;
            
        case TOKTLPAR:                      /* function call with arguments */
            cnt = prsgargs(ctx, n->prsnv.prsnvn[1]);      /* push arguments */
            prsgfn(ctx, n->prsnv.prsnvn[0], cnt);
            break;
        
        case TOKTASSIGN:
        case TOKTPLEQ:
        case TOKTMINEQ:
        case TOKTDIVEQ:
        case TOKTMODEQ:
        case TOKTTIMEQ:
        case TOKTBANDEQ:
        case TOKTBOREQ:
        case TOKTXOREQ:
        case TOKTSHLEQ:
        case TOKTSHREQ:
            prsgexp(ctx, n->prsnv.prsnvn[1]);      /* eval right side of := */
            prsglval(ctx, n->prsntyp, n->prsnv.prsnvn[0]);
            break;
            
        case TOKTDOT:
            prsgdot(ctx, n, 0);
            break;

        case TOKTDOTSPEC:
            prsgdotspec(ctx, n);
            break;
            
        case TOKTLBRACK:
            prsgexp(ctx, n->prsnv.prsnvn[0]);    /* push list being indexed */
            prsgexp(ctx, n->prsnv.prsnvn[1]);       /* push the index value */
            emtop(ctx->prscxemt, OPCINDEX);
            break;
        
        case TOKTRBRACK:
        {
            prsndef *nsub;
            uint     cnt;
            
            for (cnt = 0, nsub = n ; nsub
                 ; ++cnt, nsub = nsub->prsnv.prsnvn[1])
                prsgexp(ctx, nsub->prsnv.prsnvn[0]);
            emtop(ctx->prscxemt, OPCCONS);         /* construction operator */
            emtint2(ctx->prscxemt, cnt);
            break;
        }
            
        default:
            errsig(ctx->prscxerr, ERR_INVBIN);
        }
        break;

    case 3:
        switch(n->prsntyp)
        {
        case TOKTQUESTION:
        {
            uint lfalse;                          /* label for FALSE branch */
            uint ldone;                       /* label for end of condition */
            
            prsgexp(ctx, n->prsnv.prsnvn[0]);         /* evaluate condition */
            lfalse = emtglbl(ctx->prscxemt);
            emtjmp(ctx->prscxemt, OPCJF, lfalse);
            prsgexp(ctx, n->prsnv.prsnvn[1]);             /* eval TRUE expr */
            ldone = emtglbl(ctx->prscxemt);
            emtjmp(ctx->prscxemt, OPCJMP, ldone);
            emtslbl(ctx->prscxemt, &lfalse, TRUE);
            prsgexp(ctx, n->prsnv.prsnvn[2]);          /* eval FALSE branch */
            emtslbl(ctx->prscxemt, &ldone, TRUE);
            break;
        }
        case TOKTDOT:
            cnt = prsgargs(ctx, n->prsnv.prsnvn[2]);
            prsgdot(ctx, n, cnt);
            break;
        }
        break;
    }
}